

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileSort.cpp
# Opt level: O2

int sortTwoFiles(string *file1,string *file2)

{
  bool bVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  bool bVar5;
  bool bVar6;
  int fileValue2;
  int fileValue1;
  ofstream outFileStream;
  byte abStack_620 [480];
  ifstream fileStream2;
  byte abStack_420 [488];
  ifstream fileStream1;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fileStream1);
  std::ifstream::ifstream(&fileStream2);
  std::ofstream::ofstream(&outFileStream);
  std::ifstream::open((char *)&fileStream1,(_Ios_Openmode)(file1->_M_dataplus)._M_p);
  std::ifstream::open((char *)&fileStream2,(_Ios_Openmode)(file2->_M_dataplus)._M_p);
  std::ofstream::open((char *)&outFileStream,(_Ios_Openmode)OUT_FILE_NAME);
  if ((((abStack_218[*(long *)(_fileStream1 + -0x18)] & 5) != 0) ||
      ((abStack_420[*(long *)(_fileStream2 + -0x18)] & 5) != 0)) ||
     ((abStack_620[*(long *)(_outFileStream + -0x18)] & 5) != 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ERROR!");
    std::endl<char,std::char_traits<char>>(poVar4);
    if ((abStack_218[*(long *)(_fileStream1 + -0x18)] & 5) != 0) goto LAB_00102531;
    goto LAB_001024e7;
  }
  bVar5 = true;
  file2 = (string *)0x0;
  bVar6 = true;
  file1 = (string *)CONCAT71((int7)((ulong)file1 >> 8),1);
  bVar1 = true;
  do {
    if (((byte)file1 & bVar5) != 0) {
      plVar3 = (long *)std::istream::operator>>((istream *)&fileStream1,&fileValue1);
      bVar5 = (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0;
      file1 = (string *)((ulong)file1 & 0xff);
      if (bVar5) {
        file1 = file2;
      }
    }
    if ((bool)(bVar1 & bVar6)) {
      plVar3 = (long *)std::istream::operator>>((istream *)&fileStream2,&fileValue2);
      bVar6 = (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0;
      if (bVar6) {
        bVar1 = false;
      }
    }
    bVar2 = bVar1;
    if (((ulong)file1 & 1) == 0) {
      if (bVar1) {
LAB_0010241b:
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&outFileStream,fileValue2);
        std::operator<<(poVar4,'\n');
        bVar6 = true;
        bVar2 = true;
      }
    }
    else if (bVar1) {
      if (((fileValue2 < fileValue1) && (((ulong)file1 & 1) != 0)) && (bVar1)) goto LAB_0010241b;
      if (((fileValue1 < fileValue2) && (((ulong)file1 & 1) != 0)) && (bVar1)) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&outFileStream,fileValue1);
        std::operator<<(poVar4,'\n');
        bVar5 = true;
        bVar2 = true;
      }
      else if ((fileValue1 == fileValue2) && (((ulong)file1 & 1) != 0)) {
        if (!bVar1) goto LAB_00102452;
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&outFileStream,fileValue1);
        poVar4 = std::operator<<(poVar4,'\n');
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,fileValue2);
        std::operator<<(poVar4,'\n');
        bVar5 = true;
        bVar6 = true;
        bVar2 = true;
      }
    }
    else {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&outFileStream,fileValue1);
      std::operator<<(poVar4,'\n');
      bVar5 = true;
LAB_00102452:
      bVar2 = false;
    }
    if ((((ulong)file1 & 1) == 0) && (!bVar2)) {
      do {
        std::ifstream::close();
        std::ifstream::close();
        std::ofstream::close();
LAB_00102531:
        poVar4 = std::operator<<((ostream *)&std::cout,"Unable to read from file: ");
        poVar4 = std::operator<<(poVar4,(string *)file1);
        std::endl<char,std::char_traits<char>>(poVar4);
LAB_001024e7:
        if ((abStack_420[*(long *)(_fileStream2 + -0x18)] & 5) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Unable to read from file: ");
          poVar4 = std::operator<<(poVar4,(string *)file2);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        if ((abStack_620[*(long *)(_outFileStream + -0x18)] & 5) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Unable to write to file: ");
          poVar4 = std::operator<<(poVar4,OUT_FILE_NAME);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      } while( true );
    }
  } while( true );
}

Assistant:

int sortTwoFiles(std::string file1, std::string file2)
{
    std::ifstream fileStream1;
    std::ifstream fileStream2;
    std::ofstream outFileStream;

    //open files for reading and check to make sure we don't have any errors

    fileStream1.open(file1.c_str());
    fileStream2.open(file2.c_str());
    outFileStream.open(OUT_FILE_NAME);


    int fileValue1;
    int fileValue2;
    bool fileValue1Used = true;
    bool fileValue2Used = true;
    bool fileContinue1 = true;
    bool fileContinue2 = true;

    if(fileStream1 && fileStream2 && outFileStream)
    {
        //if we have gotten this far, we can read or write to all files
        do
        {
            //Populate our variables and see if we need to keep populating from a
            //given file
            if(fileContinue1 && fileValue1Used)
            {
                if (fileStream1 >> fileValue1)
                {
                    fileValue1Used = false;
                }
                else
                {
                    fileContinue1 = false;
                }
            }
            if(fileContinue2 && fileValue2Used)
            {
                if (fileStream2 >> fileValue2)
                {
                    fileValue2Used = false;
                }
                else
                {
                    fileContinue2 = false;

                }
            }

            //Now the logic to write out...

            if(!fileContinue1 && fileContinue2)
            {
                outFileStream << fileValue2 << '\n';
                fileValue2Used = true;


            }
            else if(fileContinue1 && !fileContinue2)
            {
                outFileStream << fileValue1 << '\n';
                fileValue1Used = true;
            }
            else if((fileValue1 > fileValue2) && (fileContinue1 && fileContinue2))
            {
                outFileStream << fileValue2 << '\n';
                fileValue2Used = true;
            }
            else if((fileValue1 < fileValue2) && (fileContinue1 && fileContinue2))
            {
                outFileStream << fileValue1 << '\n';
                fileValue1Used = true;
            }
            else if((fileValue1 == fileValue2) && (fileContinue1 && fileContinue2))
            {
                outFileStream << fileValue1 << '\n' << fileValue2 << '\n';
                fileValue1Used = true;
                fileValue2Used = true;
            }



        } while(fileContinue1 || fileContinue2);

    }
    else
    {
        std::cout << "ERROR!" << std::endl;

        if(!fileStream1)
        {
            std::cout << "Unable to read from file: " << file1 << std::endl;
        }
        if(!fileStream2)
        {
            std::cout << "Unable to read from file: " << file2 << std::endl;
        }
        if(!outFileStream)
        {
            std::cout << "Unable to write to file: " << OUT_FILE_NAME << std::endl;
        }
    }

    fileStream1.close();
    fileStream2.close();
    outFileStream.close();


}